

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int termIsEquivalence(Parse *pParse,Expr *pExpr)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  CollSeq *pCVar4;
  int iVar5;
  
  iVar5 = 0;
  iVar3 = 0;
  if (((pParse->db->dbOptFlags & 0x80) == 0) &&
     (((iVar3 = iVar5, pExpr->op == '5' || (pExpr->op == '-')) && ((pExpr->flags & 1) == 0)))) {
    bVar1 = sqlite3ExprAffinity(pExpr->pLeft);
    bVar2 = sqlite3ExprAffinity(pExpr->pRight);
    if ((bVar1 == bVar2) || (0x42 < bVar2 && 0x42 < bVar1)) {
      pCVar4 = sqlite3BinaryCompareCollSeq(pParse,pExpr->pLeft,pExpr->pRight);
      iVar3 = 1;
      if ((pCVar4 != (CollSeq *)0x0) &&
         ((pCVar4->xCmp != binCollFunc || (pCVar4->pUser != (void *)0x0)))) {
        iVar3 = sqlite3ExprCollSeqMatch(pParse,pExpr->pLeft,pExpr->pRight);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

static int termIsEquivalence(Parse *pParse, Expr *pExpr){
  char aff1, aff2;
  CollSeq *pColl;
  if( !OptimizationEnabled(pParse->db, SQLITE_Transitive) ) return 0;
  if( pExpr->op!=TK_EQ && pExpr->op!=TK_IS ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return 0;
  aff1 = sqlite3ExprAffinity(pExpr->pLeft);
  aff2 = sqlite3ExprAffinity(pExpr->pRight);
  if( aff1!=aff2
   && (!sqlite3IsNumericAffinity(aff1) || !sqlite3IsNumericAffinity(aff2))
  ){
    return 0;
  }
  pColl = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft, pExpr->pRight);
  if( sqlite3IsBinary(pColl) ) return 1;
  return sqlite3ExprCollSeqMatch(pParse, pExpr->pLeft, pExpr->pRight);
}